

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyDataSPKM::CheckDecryptionKey(LegacyDataSPKM *this,CKeyingMaterial *master_key)

{
  _Base_ptr *pub_key;
  size_t sVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  mapped_type *keyMeta;
  _Base_ptr p_Var5;
  runtime_error *this_00;
  LogFlags flag;
  long in_FS_OFFSET;
  bool bVar6;
  string_view source_file;
  span<const_unsigned_char,_18446744073709551615UL> crypted_secret;
  string_view logging_function;
  Level in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar7;
  CKey key;
  WalletBatch local_70;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  CKeyID local_4c;
  long local_38;
  WalletDatabase *pWVar4;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  flag = NONE;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&(this->super_FillableSigningProvider).cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0xee,false);
  if ((this->super_FillableSigningProvider).mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count
      != 0) {
    __assert_fail("mapKeys.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0xef,
                  "virtual bool wallet::LegacyDataSPKM::CheckDecryptionKey(const CKeyingMaterial &)"
                 );
  }
  p_Var5 = (this->mapCryptedKeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar1 = (this->mapCryptedKeys)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  iVar3 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[3])();
  pWVar4 = (WalletDatabase *)CONCAT44(extraout_var_00,iVar3);
  (*pWVar4->_vptr_WalletDatabase[0xe])(&local_70,pWVar4,1);
  bVar6 = sVar1 == 0;
  uVar7 = 0;
  local_70.m_database = pWVar4;
  for (; (_Rb_tree_header *)p_Var5 != &(this->mapCryptedKeys)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
    key.fCompressed = false;
    key.keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            )0x0;
    pub_key = &p_Var5[1]._M_right;
    crypted_secret._M_extent._M_extent_value =
         (long)p_Var5[4]._M_parent - (long)*(pointer *)(p_Var5 + 4);
    crypted_secret._M_ptr = *(pointer *)(p_Var5 + 4);
    bVar2 = DecryptKey(master_key,crypted_secret,(CPubKey *)pub_key,&key);
    if (bVar2) {
      if (this->fDecryptionThoroughlyChecked != false) {
        bVar6 = true;
        goto LAB_001effa4;
      }
      CPubKey::GetID(&local_4c,(CPubKey *)pub_key);
      keyMeta = std::
                map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                ::operator[](&this->mapKeyMetadata,&local_4c);
      WalletBatch::WriteCryptedKey
                (&local_70,(CPubKey *)pub_key,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var5 + 4),keyMeta);
      bVar6 = true;
      bVar2 = true;
    }
    else {
      uVar7 = (uint)CONCAT71(extraout_var,1);
LAB_001effa4:
      bVar2 = false;
    }
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&key.keydata);
    if (!bVar2) break;
  }
  if (bVar6 != false) {
    if ((uVar7 & 1) != 0) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
      ;
      source_file._M_len = 99;
      logging_function._M_str = "CheckDecryptionKey";
      logging_function._M_len = 0x12;
      LogPrintf_<>(logging_function,source_file,0x109,flag,in_stack_ffffffffffffff68,
                   (char *)CONCAT44(uVar7,in_stack_ffffffffffffff70));
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "Error unlocking wallet: some keys decrypt but not all. Your wallet file may be corrupt."
                );
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_001f0147;
    }
    this->fDecryptionThoroughlyChecked = true;
  }
  if (local_70.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (*(*(_func_int ***)
        local_70.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
LAB_001f0147:
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::CheckDecryptionKey(const CKeyingMaterial& master_key)
{
    {
        LOCK(cs_KeyStore);
        assert(mapKeys.empty());

        bool keyPass = mapCryptedKeys.empty(); // Always pass when there are no encrypted keys
        bool keyFail = false;
        CryptedKeyMap::const_iterator mi = mapCryptedKeys.begin();
        WalletBatch batch(m_storage.GetDatabase());
        for (; mi != mapCryptedKeys.end(); ++mi)
        {
            const CPubKey &vchPubKey = (*mi).second.first;
            const std::vector<unsigned char> &vchCryptedSecret = (*mi).second.second;
            CKey key;
            if (!DecryptKey(master_key, vchCryptedSecret, vchPubKey, key))
            {
                keyFail = true;
                break;
            }
            keyPass = true;
            if (fDecryptionThoroughlyChecked)
                break;
            else {
                // Rewrite these encrypted keys with checksums
                batch.WriteCryptedKey(vchPubKey, vchCryptedSecret, mapKeyMetadata[vchPubKey.GetID()]);
            }
        }
        if (keyPass && keyFail)
        {
            LogPrintf("The wallet is probably corrupted: Some keys decrypt but not all.\n");
            throw std::runtime_error("Error unlocking wallet: some keys decrypt but not all. Your wallet file may be corrupt.");
        }
        if (keyFail || !keyPass)
            return false;
        fDecryptionThoroughlyChecked = true;
    }
    return true;
}